

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Function_Type.cxx
# Opt level: O2

void __thiscall Fl_Function_Type::write_code1(Fl_Function_Type *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  size_t __n;
  bool bVar6;
  int iVar7;
  char **ppcVar8;
  char *pcVar9;
  char cVar10;
  int iVar11;
  Fl_Function_Type *l;
  int iVar12;
  long lVar13;
  bool bVar14;
  char *local_460;
  char s [1024];
  
  this->constructor = '\0';
  this->havewidgets = '\0';
  bVar6 = true;
  l = this;
  do {
    l = (Fl_Function_Type *)(l->super_Fl_Type).next;
    if ((l == (Fl_Function_Type *)0x0) || ((l->super_Fl_Type).level <= (this->super_Fl_Type).level))
    {
      if (!bVar6) goto LAB_0017a705;
      if ((this->super_Fl_Type).name_ == (char *)0x0) goto LAB_0017adc0;
      bVar6 = true;
      goto LAB_0017a726;
    }
    iVar3 = (*(l->super_Fl_Type)._vptr_Fl_Type[0x17])(l);
    bVar6 = false;
  } while (iVar3 == 0);
  this->havewidgets = '\x01';
LAB_0017a705:
  write_c("\n");
  if ((this->super_Fl_Type).name_ == (char *)0x0) {
    write_c("int main(int argc, char **argv) {\n");
    goto LAB_0017adc0;
  }
  bVar6 = false;
LAB_0017a726:
  ppcVar8 = &(this->super_Fl_Type).name_;
  pcVar5 = this->return_type;
  if (pcVar5 == (char *)0x0) {
    bVar14 = false;
    bVar1 = true;
LAB_0017a7dd:
    if (this->havewidgets == '\0') {
      local_460 = "";
      pcVar4 = "void";
    }
    else {
      pcVar4 = subclassname((Fl_Type *)l);
      local_460 = "*";
    }
  }
  else {
    iVar3 = strcmp(pcVar5,"static");
    if (iVar3 == 0) {
      bVar14 = true;
      pcVar4 = (char *)0x0;
    }
    else {
      iVar3 = strncmp(pcVar5,"static ",7);
      bVar14 = iVar3 == 0;
      pcVar4 = pcVar5 + 7;
      if (!bVar14) {
        pcVar4 = pcVar5;
      }
    }
    iVar3 = strcmp(pcVar4,"virtual");
    if (iVar3 == 0) {
      bVar1 = false;
      goto LAB_0017a7dd;
    }
    iVar3 = strncmp(pcVar4,"virtual ",8);
    local_460 = "";
    if (iVar3 == 0) {
      pcVar4 = pcVar4 + 8;
      bVar1 = false;
    }
    else {
      bVar1 = true;
      if (pcVar4 == (char *)0x0) goto LAB_0017a7dd;
    }
  }
  pcVar5 = Fl_Type::class_name(&this->super_Fl_Type,0);
  if (pcVar5 != (char *)0x0) {
    if (!bVar6) {
      Fl_Type::write_comment_c(&this->super_Fl_Type,"");
    }
    write_public((int)this->public_);
    pcVar9 = (this->super_Fl_Type).name_;
    if (*pcVar9 != '~') {
      __n = strlen(pcVar5);
      iVar3 = strncmp(pcVar9,pcVar5,__n);
      if ((iVar3 != 0) || (pcVar9[__n] != '(')) goto LAB_0017a8c5;
    }
    this->constructor = '\x01';
LAB_0017a8c5:
    write_h("  ");
    if (bVar14) {
      write_h("static ");
    }
    if (!bVar1) {
      write_h("virtual ");
    }
    if ((this->constructor == '\0') && (write_h("%s%s ",pcVar4,local_460), !bVar6)) {
      write_c("%s%s ",pcVar4,local_460);
    }
    pcVar9 = *ppcVar8;
    pcVar4 = s;
    do {
      cVar10 = *pcVar9;
      if (cVar10 == ':') {
        if (pcVar9[1] != ':') goto LAB_0017a973;
        pcVar9 = pcVar9 + 1;
        *pcVar4 = ':';
        pcVar4 = pcVar4 + 1;
        cVar10 = *pcVar9;
      }
      else if (cVar10 == '\0') goto LAB_0017a973;
      pcVar9 = pcVar9 + 1;
      *pcVar4 = cVar10;
      pcVar4 = pcVar4 + 1;
    } while( true );
  }
  if (bVar6) {
    if (this->public_ != '\0') {
LAB_0017ab95:
      if (this->cdecl_ == '\0') {
        pcVar5 = "%s%s %s;\n";
      }
      else {
        pcVar5 = "extern \"C\" { %s%s %s; }\n";
      }
      write_h(pcVar5,pcVar4,local_460,(this->super_Fl_Type).name_);
    }
  }
  else {
    Fl_Type::write_comment_c(&this->super_Fl_Type,"");
    if (this->public_ != '\0') goto LAB_0017ab95;
    write_c("static ");
  }
  lVar13 = 0;
  bVar14 = false;
  bVar1 = false;
  iVar11 = 0;
  iVar3 = 0;
  for (pcVar5 = *ppcVar8; cVar10 = *pcVar5, cVar10 != '\0'; pcVar5 = pcVar5 + 1) {
    if ((!bVar14) && (cVar10 == '(')) {
      iVar3 = iVar3 + 1;
LAB_0017ac04:
      bVar2 = false;
    }
    else if (bVar14) {
      if (cVar10 == '\"') {
LAB_0017ac4d:
        bVar2 = !bVar14;
        if (iVar11 != 0) {
          bVar2 = (pcVar5[-1] == '\\') != !bVar14;
        }
      }
      else {
        bVar2 = true;
      }
    }
    else {
      iVar3 = iVar3 - (uint)(cVar10 == ')');
      if (cVar10 == '\"') goto LAB_0017ac4d;
      if ((cVar10 != '\'') || ((iVar11 != 0 && (pcVar5[-1] == '\\')))) goto LAB_0017ac04;
      bVar1 = !bVar1;
      bVar2 = false;
    }
    bVar14 = bVar2;
    if (((!bVar14) && (!bVar1)) && (iVar3 == 1)) {
      iVar7 = 1;
      if ((cVar10 == '=') && ((iVar11 == 0 || (cVar10 = '=', pcVar5[-1] != '\'')))) {
        bVar1 = false;
        iVar3 = iVar7;
        do {
          bVar14 = false;
          pcVar9 = pcVar5;
LAB_0017acab:
          do {
            pcVar5 = pcVar9 + 1;
            cVar10 = *pcVar5;
            if (cVar10 == '\0') {
              cVar10 = '\0';
              goto LAB_0017ad7a;
            }
            if (bVar14 || bVar1) {
LAB_0017acd4:
              if (cVar10 == '\"') {
                if (*pcVar9 == '\\') {
                  if (bVar14) goto LAB_0017acec;
                  bVar14 = false;
                }
                else {
                  bVar14 = !bVar14;
                }
              }
              else {
                if (bVar14) {
LAB_0017acec:
                  bVar14 = true;
                  pcVar9 = pcVar5;
                  goto LAB_0017acab;
                }
                bVar14 = false;
                if ((cVar10 == '\'') && (bVar14 = false, *pcVar9 != '\\')) {
                  bVar1 = !bVar1;
                }
              }
            }
            else {
              if (cVar10 != ',') {
                if ((cVar10 != ')') || (iVar3 != 1)) goto LAB_0017acd4;
                cVar10 = ')';
                goto LAB_0017ad75;
              }
              bVar14 = false;
              if (iVar3 == 1) {
                cVar10 = ',';
                goto LAB_0017ad75;
              }
              bVar1 = false;
            }
            if (!bVar14 && !bVar1) {
              bVar1 = false;
              iVar12 = iVar7;
              if (cVar10 == '(') goto LAB_0017ad62;
              break;
            }
            pcVar9 = pcVar5;
          } while (bVar14);
          iVar12 = -(uint)(cVar10 == ')');
LAB_0017ad62:
          iVar3 = iVar3 + iVar12;
        } while( true );
      }
LAB_0017ad75:
      bVar14 = false;
      bVar1 = false;
      iVar3 = iVar7;
    }
LAB_0017ad7a:
    if (lVar13 < 0x3ff) {
      s[lVar13] = cVar10;
      lVar13 = lVar13 + 1;
    }
    iVar11 = iVar11 + 1;
  }
  s[lVar13] = '\0';
  if (!bVar6) {
    write_c("%s%s %s {\n",pcVar4,local_460,s);
  }
LAB_0017adc0:
  if ((this->havewidgets != '\0') && ((l->super_Fl_Type).name_ == (char *)0x0)) {
    pcVar5 = subclassname((Fl_Type *)l);
    write_c("  %s* w;\n",pcVar5);
  }
  indentation = indentation + 2;
  return;
LAB_0017a973:
  *pcVar4 = '\0';
  lVar13 = 0;
  write_h("%s;\n");
  bVar14 = false;
  bVar1 = false;
  iVar11 = 0;
  iVar3 = 0;
  for (pcVar4 = *ppcVar8; cVar10 = *pcVar4, cVar10 != '\0'; pcVar4 = pcVar4 + 1) {
    if ((!bVar14) && (cVar10 == '(')) {
      iVar3 = iVar3 + 1;
LAB_0017a9ba:
      bVar2 = false;
    }
    else if (bVar14) {
      if (cVar10 == '\"') {
LAB_0017aa04:
        bVar2 = !bVar14;
        if (iVar11 != 0) {
          bVar2 = (pcVar4[-1] == '\\') != !bVar14;
        }
      }
      else {
        bVar2 = true;
      }
    }
    else {
      iVar3 = iVar3 - (uint)(cVar10 == ')');
      if (cVar10 == '\"') goto LAB_0017aa04;
      if ((cVar10 != '\'') || ((iVar11 != 0 && (pcVar4[-1] == '\\')))) goto LAB_0017a9ba;
      bVar1 = !bVar1;
      bVar2 = false;
    }
    bVar14 = bVar2;
    if (((!bVar14) && (!bVar1)) && (iVar3 == 1)) {
      iVar7 = 1;
      if ((cVar10 == '=') && ((iVar11 == 0 || (cVar10 = '=', pcVar4[-1] != '\'')))) {
        bVar1 = false;
        iVar3 = iVar7;
        do {
          bVar14 = false;
          pcVar9 = pcVar4;
LAB_0017aa60:
          do {
            pcVar4 = pcVar9 + 1;
            cVar10 = *pcVar4;
            if (cVar10 == '\0') {
              cVar10 = '\0';
              goto LAB_0017ab2b;
            }
            if (bVar14 || bVar1) {
LAB_0017aa89:
              if (cVar10 == '\"') {
                if (*pcVar9 == '\\') {
                  if (bVar14) goto LAB_0017aaa1;
                  bVar14 = false;
                }
                else {
                  bVar14 = !bVar14;
                }
              }
              else {
                if (bVar14) {
LAB_0017aaa1:
                  bVar14 = true;
                  pcVar9 = pcVar4;
                  goto LAB_0017aa60;
                }
                bVar14 = false;
                if ((cVar10 == '\'') && (bVar14 = false, *pcVar9 != '\\')) {
                  bVar1 = !bVar1;
                }
              }
            }
            else {
              if (cVar10 != ',') {
                if ((cVar10 != ')') || (iVar3 != 1)) goto LAB_0017aa89;
                cVar10 = ')';
                goto LAB_0017ab27;
              }
              bVar14 = false;
              if (iVar3 == 1) {
                cVar10 = ',';
                goto LAB_0017ab27;
              }
              bVar1 = false;
            }
            if (!bVar14 && !bVar1) {
              bVar1 = false;
              iVar12 = iVar7;
              if (cVar10 == '(') goto LAB_0017ab14;
              break;
            }
            pcVar9 = pcVar4;
          } while (bVar14);
          iVar12 = -(uint)(cVar10 == ')');
LAB_0017ab14:
          iVar3 = iVar3 + iVar12;
        } while( true );
      }
LAB_0017ab27:
      bVar14 = false;
      bVar1 = false;
      iVar3 = iVar7;
    }
LAB_0017ab2b:
    if (lVar13 < 0x3ff) {
      s[lVar13] = cVar10;
      lVar13 = lVar13 + 1;
    }
    iVar11 = iVar11 + 1;
  }
  s[lVar13] = '\0';
  if (!bVar6) {
    write_c("%s::%s {\n",pcVar5,s);
  }
  goto LAB_0017adc0;
}

Assistant:

void Fl_Function_Type::write_code1() {
  constructor=0;
  havewidgets = 0;
  Fl_Type *child;
  // if the function has no children (hence no body), Fluid will not generate
  // the function either. This is great if you decide to implement that function
  // inside another module
  char havechildren = 0;
  for (child = next; child && child->level > level; child = child->next) {
    havechildren = 1;
    if (child->is_widget()) {
      havewidgets = 1;
      break;
    }
  }
  if (havechildren)
    write_c("\n");
  if (ismain()) {
    if (havechildren)
      write_c("int main(int argc, char **argv) {\n");
  } else {
    const char* rtype = return_type;
    const char* star = "";
    // from matt: let the user type "static " at the start of type
    // in order to declare a static method;
    int is_static = 0;
    int is_virtual = 0;
    if (rtype) {
      if (!strcmp(rtype,"static")) {is_static = 1; rtype = 0;}
      else if (!strncmp(rtype, "static ",7)) {is_static = 1; rtype += 7;}
      if (!strcmp(rtype, "virtual")) {is_virtual = 1; rtype = 0;}
      else if (!strncmp(rtype, "virtual ",8)) {is_virtual = 1; rtype += 8;}
    }
    if (!rtype) {
      if (havewidgets) {
        rtype = subclassname(child);
        star = "*";
      } else rtype = "void";
    }
    
    const char* k = class_name(0);
    if (k) {
      if (havechildren)
        write_comment_c();
      write_public(public_);
      if (name()[0] == '~')
        constructor = 1;
      else {
        size_t n = strlen(k);
        if (!strncmp(name(), k, n) && name()[n] == '(') constructor = 1;
      }
      write_h("  ");
      if (is_static) write_h("static ");
      if (is_virtual) write_h("virtual ");
      if (!constructor) {
        write_h("%s%s ", rtype, star);
        if (havechildren)
          write_c("%s%s ", rtype, star);
      }
      
      // if this is a subclass, only write_h() the part before the ':'
      char s[1024], *sptr = s;
      char *nptr = (char *)name();
      
      while (*nptr) {
        if (*nptr == ':') {
          if (nptr[1] != ':') break;
          // Copy extra ":" for "class::member"...
          *sptr++ = *nptr++;
        }	  
        *sptr++ = *nptr++;
      }
      *sptr = '\0';
      
      write_h("%s;\n", s);
      // skip all function default param. init in body:
      int skips=0,skipc=0;
      int nc=0,plevel=0;
      for (sptr=s,nptr=(char*)name(); *nptr; nc++,nptr++) {
        if (!skips && *nptr=='(') plevel++;
        else if (!skips && *nptr==')') plevel--;
        if ( *nptr=='"' &&  !(nc &&  *(nptr-1)=='\\') ) 
          skips = skips ? 0 : 1;
        else if(!skips && *nptr=='\'' &&  !(nc &&  *(nptr-1)=='\\'))
          skipc = skipc ? 0 : 1;
        if(!skips && !skipc && plevel==1 && *nptr =='=' && 
           !(nc && *(nptr-1)=='\'') ) // ignore '=' case 
          while(*++nptr  && (skips || skipc || ( (*nptr!=',' && *nptr!=')') || plevel!=1) )) {
            if ( *nptr=='"' &&  *(nptr-1)!='\\' ) 
              skips = skips ? 0 : 1;
            else if(!skips && *nptr=='\'' &&  *(nptr-1)!='\\')
              skipc = skipc ? 0 : 1;
            if (!skips && !skipc && *nptr=='(') plevel++;
            else if (!skips && *nptr==')') plevel--;
          }
        
        if (sptr < (s + sizeof(s) - 1))	*sptr++ = *nptr;
      }
      *sptr = '\0';
      
      if (havechildren)
        write_c("%s::%s {\n", k, s);
    } else {
      if (havechildren)
        write_comment_c();
      if (public_) {
        if (cdecl_)
          write_h("extern \"C\" { %s%s %s; }\n", rtype, star, name());
        else
          write_h("%s%s %s;\n", rtype, star, name());
      } else {
        if (havechildren)
          write_c("static ");
      }
      
      // write everything but the default parameters (if any)
      char s[1024], *sptr;
      char *nptr;
      int skips=0,skipc=0;
      int nc=0,plevel=0;
      for (sptr=s,nptr=(char*)name(); *nptr; nc++,nptr++) {
        if (!skips && *nptr=='(') plevel++;
        else if (!skips && *nptr==')') plevel--;
        if ( *nptr=='"' &&  !(nc &&  *(nptr-1)=='\\') ) 
          skips = skips ? 0 : 1;
        else if(!skips && *nptr=='\'' &&  !(nc &&  *(nptr-1)=='\\'))
          skipc = skipc ? 0 : 1;
        if(!skips && !skipc && plevel==1 && *nptr =='=' && 
           !(nc && *(nptr-1)=='\'') ) // ignore '=' case 
          while(*++nptr  && (skips || skipc || ( (*nptr!=',' && *nptr!=')') || plevel!=1) )) {
            if ( *nptr=='"' &&  *(nptr-1)!='\\' ) 
              skips = skips ? 0 : 1;
            else if(!skips && *nptr=='\'' &&  *(nptr-1)!='\\')
              skipc = skipc ? 0 : 1;
            if (!skips && !skipc && *nptr=='(') plevel++;
            else if (!skips && *nptr==')') plevel--;
          }
        
        if (sptr < (s + sizeof(s) - 1))	*sptr++ = *nptr;
      }
      *sptr = '\0';
      
      if (havechildren)
        write_c("%s%s %s {\n", rtype, star, s);
    }
  }
  
  if (havewidgets && !child->name()) write_c("  %s* w;\n", subclassname(child));
  indentation += 2;
}